

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall BuildTestRspFileFailure::Run(BuildTestRspFileFailure *this)

{
  VirtualFileSystem *this_00;
  int *piVar1;
  Builder *this_01;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  Test *pTVar5;
  bool bVar6;
  Node *pNVar7;
  size_type sVar8;
  mapped_type *pmVar9;
  string err;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  iVar2 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule fail\n  command = fail\n  rspfile = $rspfile\n  rspfile_content = $long_command\nbuild out: fail in\n  rspfile = out.rsp\n  long_command = Another very long command\n"
              ,(ManifestParserOptions)0x0);
  if (iVar2 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"out",&local_72);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
  this_00 = &(this->super_BuildTest).fs_;
  VirtualFileSystem::Create(this_00,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  piVar1 = &(this->super_BuildTest).fs_.now_;
  *piVar1 = *piVar1 + 1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"in",&local_72);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
  VirtualFileSystem::Create(this_00,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar5 = g_current_test;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"out",&local_72);
  this_01 = &(this->super_BuildTest).builder_;
  pNVar7 = Builder::AddTarget(this_01,&local_70,&local_50);
  testing::Test::Check
            (pTVar5,pNVar7 != (Node *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
             ,0x690,"builder_.AddTarget(\"out\", &err)");
  std::__cxx11::string::~string((string *)&local_70);
  pTVar5 = g_current_test;
  bVar6 = std::operator==("",&local_50);
  bVar6 = testing::Test::Check
                    (pTVar5,bVar6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                     ,0x691,"\"\" == err");
  pTVar5 = g_current_test;
  if (bVar6) {
    sVar3 = (this->super_BuildTest).fs_.files_removed_._M_t._M_impl.super__Rb_tree_header.
            _M_node_count;
    sVar4 = (this->super_BuildTest).fs_.files_created_._M_t._M_impl.super__Rb_tree_header.
            _M_node_count;
    bVar6 = Builder::Build(this_01,&local_50);
    testing::Test::Check
              (pTVar5,!bVar6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x696,"builder_.Build(&err)");
    pTVar5 = g_current_test;
    bVar6 = std::operator==("subcommand failed",&local_50);
    bVar6 = testing::Test::Check
                      (pTVar5,bVar6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x697,"\"subcommand failed\" == err");
    if (((bVar6) &&
        (bVar6 = testing::Test::Check
                           (g_current_test,
                            (long)(this->super_BuildTest).command_runner_.commands_ran_.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->super_BuildTest).command_runner_.commands_ran_.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start == 0x20,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                            ,0x698,"1u == command_runner_.commands_ran_.size()"), bVar6)) &&
       (bVar6 = testing::Test::Check
                          (g_current_test,
                           sVar4 + 1 ==
                           (this->super_BuildTest).fs_.files_created_._M_t._M_impl.
                           super__Rb_tree_header._M_node_count,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x69b,"files_created + 1 == fs_.files_created_.size()"),
       pTVar5 = g_current_test, bVar6)) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"out.rsp",&local_72);
      sVar8 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&(this->super_BuildTest).fs_.files_created_,&local_70);
      bVar6 = testing::Test::Check
                        (pTVar5,sVar8 == 1,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x69c,"1u == fs_.files_created_.count(\"out.rsp\")");
      std::__cxx11::string::~string((string *)&local_70);
      if ((bVar6) &&
         (bVar6 = testing::Test::Check
                            (g_current_test,
                             sVar3 == (this->super_BuildTest).fs_.files_removed_._M_t._M_impl.
                                      super__Rb_tree_header._M_node_count,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                             ,0x69f,"files_removed == fs_.files_removed_.size()"),
         pTVar5 = g_current_test, bVar6)) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"out.rsp",&local_72);
        sVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&(this->super_BuildTest).fs_.files_removed_,&local_70);
        bVar6 = testing::Test::Check
                          (pTVar5,sVar8 == 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x6a0,"0u == fs_.files_removed_.count(\"out.rsp\")");
        std::__cxx11::string::~string((string *)&local_70);
        pTVar5 = g_current_test;
        if (bVar6) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_70,"out.rsp",&local_72);
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry>_>_>
                   ::operator[](&(this->super_BuildTest).fs_.files_,&local_70);
          bVar6 = std::operator==("Another very long command",&pmVar9->contents);
          bVar6 = testing::Test::Check
                            (pTVar5,bVar6,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                             ,0x6a3,
                             "\"Another very long command\" == fs_.files_[\"out.rsp\"].contents");
          std::__cxx11::string::~string((string *)&local_70);
          if (bVar6) goto LAB_001289ea;
        }
      }
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_001289ea:
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

TEST_F(BuildTest, RspFileFailure) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
    "rule fail\n"
    "  command = fail\n"
    "  rspfile = $rspfile\n"
    "  rspfile_content = $long_command\n"
    "build out: fail in\n"
    "  rspfile = out.rsp\n"
    "  long_command = Another very long command\n"));

  fs_.Create("out", "");
  fs_.Tick();
  fs_.Create("in", "");

  string err;
  EXPECT_TRUE(builder_.AddTarget("out", &err));
  ASSERT_EQ("", err);

  size_t files_created = fs_.files_created_.size();
  size_t files_removed = fs_.files_removed_.size();

  EXPECT_FALSE(builder_.Build(&err));
  ASSERT_EQ("subcommand failed", err);
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());

  // The RSP file was created
  ASSERT_EQ(files_created + 1, fs_.files_created_.size());
  ASSERT_EQ(1u, fs_.files_created_.count("out.rsp"));

  // The RSP file was NOT removed
  ASSERT_EQ(files_removed, fs_.files_removed_.size());
  ASSERT_EQ(0u, fs_.files_removed_.count("out.rsp"));

  // The RSP file contains what it should
  ASSERT_EQ("Another very long command", fs_.files_["out.rsp"].contents);
}